

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O1

string * __thiscall
argvParser::getHelpMessage_abi_cxx11_(string *__return_storage_ptr__,argvParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
  *pvVar3;
  section *__rhs;
  argument *paVar4;
  bool bVar5;
  pointer ppsVar6;
  long *plVar7;
  pointer ppaVar8;
  undefined8 *puVar9;
  size_type *psVar10;
  ulong uVar11;
  string requiredArgs;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  ulong local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_100 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_100;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  pcVar2 = (this->super_argParserAdvancedConfiguration).applicationName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,pcVar2,
             pcVar2 + (this->super_argParserAdvancedConfiguration).applicationName._M_string_length)
  ;
  std::__cxx11::string::append((char *)&local_140);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_140._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  pcVar2 = (this->description)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,pcVar2,pcVar2 + (this->description)._M_string_length);
  std::__cxx11::string::append((char *)&local_140);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_140._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  local_140._M_string_length = 0;
  local_140.field_2._M_local_buf[0] = '\0';
  pvVar3 = (this->super_argParserAdvancedConfiguration).newargconfig;
  ppsVar6 = (pvVar3->
            super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((pvVar3->
      super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppsVar6) {
    paVar1 = &local_160.field_2;
    uVar11 = 0;
    do {
      __rhs = ppsVar6[uVar11];
      if ((__rhs->sectionName)._M_string_length != 0) {
        std::operator+(&local_120," ",&__rhs->sectionName);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_120);
        psVar10 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_160.field_2._M_allocated_capacity = *psVar10;
          local_160.field_2._8_8_ = plVar7[3];
          local_160._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_160.field_2._M_allocated_capacity = *psVar10;
          local_160._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_160._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_160._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != paVar1) {
          operator_delete(local_160._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p);
        }
      }
      ppaVar8 = (__rhs->arguments->
                super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_f8 = uVar11;
      if ((__rhs->arguments->
          super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
          )._M_impl.super__Vector_impl_data._M_finish != ppaVar8) {
        uVar11 = 0;
        do {
          paVar4 = ppaVar8[uVar11];
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          pcVar2 = (paVar4->argShort)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,pcVar2,pcVar2 + (paVar4->argShort)._M_string_length);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          pcVar2 = (paVar4->argLong)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar2,pcVar2 + (paVar4->argLong)._M_string_length);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          pcVar2 = (paVar4->helpMessage)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar2,pcVar2 + (paVar4->helpMessage)._M_string_length);
          argParserAdvancedConfiguration::buildHelpLine
                    (&local_160,&this->super_argParserAdvancedConfiguration,&local_90,&local_b0,
                     &local_50);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_160._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != paVar1) {
            operator_delete(local_160._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if (paVar4->requiredAndNotHitJet == true) {
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            pcVar2 = (paVar4->argShort)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,pcVar2,pcVar2 + (paVar4->argShort)._M_string_length);
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            pcVar2 = (paVar4->argLong)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f0,pcVar2,pcVar2 + (paVar4->argLong)._M_string_length);
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            pcVar2 = (paVar4->helpMessage)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,pcVar2,pcVar2 + (paVar4->helpMessage)._M_string_length);
            argParserAdvancedConfiguration::buildHelpLine
                      (&local_160,&this->super_argParserAdvancedConfiguration,&local_d0,&local_f0,
                       &local_70);
            std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_160._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != paVar1) {
              operator_delete(local_160._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
          }
          uVar11 = uVar11 + 1;
          ppaVar8 = (__rhs->arguments->
                    super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar11 < (ulong)((long)(__rhs->arguments->
                                        super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppaVar8
                                 >> 3));
      }
      uVar11 = local_f8 + 1;
      pvVar3 = (this->super_argParserAdvancedConfiguration).newargconfig;
      ppsVar6 = (pvVar3->
                super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(pvVar3->
                                    super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar6 >> 3
                             ));
  }
  bVar5 = foundAllRequierdArgs(this);
  if (!bVar5) {
    std::operator+(&local_120,"\nrequired arguments are : \n",&local_140);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
    psVar10 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_160.field_2._M_allocated_capacity = *psVar10;
      local_160.field_2._8_8_ = puVar9[3];
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar10;
      local_160._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_160._M_string_length = puVar9[1];
    *puVar9 = psVar10;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_160._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
  }
  if ((this->super_argParserAdvancedConfiguration).lastFailedArg._M_string_length != 0) {
    std::operator+(&local_160,"failed argument : ",
                   &(this->super_argParserAdvancedConfiguration).lastFailedArg);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_160._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    if ((this->super_argParserAdvancedConfiguration).errorMessage._M_string_length != 0) {
      std::operator+(&local_160,"\n  ",&(this->super_argParserAdvancedConfiguration).errorMessage);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_160._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string argvParser::getHelpMessage() {
    string s;
    s += applicationName + "\n";
    s += description + "\nUsage:\n";
    string requiredArgs;
    for(int secIndex = 0; secIndex < newargconfig->size();secIndex++ ){
        section *sec = newargconfig->at(secIndex);
        if(!sec->sectionName.empty()){
            s+= " " + sec->sectionName + ": \n";
        }
        for(int argIndex = 0; argIndex<sec->arguments->size();argIndex++){
            argument * arg = sec->arguments->at(argIndex);
            s += buildHelpLine(arg->argShort,arg->argLong,arg->helpMessage);
            if(arg->requiredAndNotHitJet)
                requiredArgs += buildHelpLine(arg->argShort, arg->argLong, arg->helpMessage);
        }
    }
    if (!foundAllRequierdArgs()) {
        s += "\nrequired arguments are : \n" + requiredArgs + "\n";
    }

    if (!lastFailedArg.empty()) {
        s += "failed argument : " + lastFailedArg;
        if (!errorMessage.empty()) {
            s += "\n  " + errorMessage;
        }
    }

    return s;
}